

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O2

void threads_stop(lzma_stream_coder_conflict1 *coder,_Bool wait_for_threads)

{
  worker_thread *pwVar1;
  ulong uVar2;
  uint32_t i_1;
  long lVar3;
  uint32_t i;
  ulong uVar4;
  
  lVar3 = 0x160;
  for (uVar4 = 0; uVar2 = (ulong)coder->threads_initialized, uVar4 < uVar2; uVar4 = uVar4 + 1) {
    mythread_mutex_lock((mythread_mutex *)((long)&coder->threads->state + lVar3));
    pwVar1 = coder->threads;
    *(undefined4 *)((long)pwVar1 + lVar3 + -0x160) = 3;
    mythread_cond_signal((mythread_cond *)((long)&pwVar1->allocator + lVar3));
    mythread_mutex_unlock((mythread_mutex *)((long)&coder->threads->state + lVar3));
    lVar3 = lVar3 + 0x1c0;
  }
  if (wait_for_threads) {
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      mythread_mutex_lock(&coder->threads[uVar4].mutex);
      while (pwVar1 = coder->threads, pwVar1[uVar4].state != THR_IDLE) {
        mythread_cond_wait(&pwVar1[uVar4].cond,&pwVar1[uVar4].mutex);
      }
      mythread_mutex_unlock(&pwVar1[uVar4].mutex);
      uVar2 = (ulong)coder->threads_initialized;
    }
  }
  return;
}

Assistant:

static void
threads_stop(lzma_stream_coder *coder, bool wait_for_threads)
{
	// Tell the threads to stop.
	for (uint32_t i = 0; i < coder->threads_initialized; ++i) {
		mythread_sync(coder->threads[i].mutex) {
			coder->threads[i].state = THR_STOP;
			mythread_cond_signal(&coder->threads[i].cond);
		}
	}

	if (!wait_for_threads)
		return;

	// Wait for the threads to settle in the idle state.
	for (uint32_t i = 0; i < coder->threads_initialized; ++i) {
		mythread_sync(coder->threads[i].mutex) {
			while (coder->threads[i].state != THR_IDLE)
				mythread_cond_wait(&coder->threads[i].cond,
						&coder->threads[i].mutex);
		}
	}

	return;
}